

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowAttrib(GLFWwindow *handle,int attrib,int value)

{
  uint uVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  GLFWbool in_stack_0000001c;
  _GLFWwindow *in_stack_00000020;
  GLFWbool enabled;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    uVar1 = (uint)(in_EDX != 0);
    if (in_ESI == 0x20006) {
      *(uint *)(in_RDI + 0x10) = uVar1;
    }
    else {
      enabled = (GLFWbool)((ulong)in_RDI >> 0x20);
      if (in_ESI == 0x20003) {
        if ((*(uint *)(in_RDI + 8) != uVar1) &&
           (*(uint *)(in_RDI + 8) = uVar1, *(long *)(in_RDI + 0x48) == 0)) {
          _glfwPlatformSetWindowResizable((_GLFWwindow *)CONCAT44(0x20003,uVar1),enabled);
        }
      }
      else if (in_ESI == 0x20005) {
        if ((*(uint *)(in_RDI + 0xc) != uVar1) &&
           (*(uint *)(in_RDI + 0xc) = uVar1, *(long *)(in_RDI + 0x48) == 0)) {
          _glfwPlatformSetWindowDecorated(in_stack_00000020,in_stack_0000001c);
        }
      }
      else if (in_ESI == 0x20007) {
        if ((*(uint *)(in_RDI + 0x14) != uVar1) &&
           (*(uint *)(in_RDI + 0x14) = uVar1, *(long *)(in_RDI + 0x48) == 0)) {
          _glfwPlatformSetWindowFloating(in_stack_00000020,in_stack_0000001c);
        }
      }
      else if (in_ESI == 0x2000c) {
        *(uint *)(in_RDI + 0x18) = uVar1;
      }
      else if (in_ESI == 0x2000d) {
        if (*(uint *)(in_RDI + 0x1c) != uVar1) {
          *(uint *)(in_RDI + 0x1c) = uVar1;
          _glfwPlatformSetWindowMousePassthrough(window,enabled);
        }
      }
      else {
        _glfwInputError(0x10003,"Invalid window attribute 0x%08X",(ulong)in_ESI);
      }
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwSetWindowAttrib(GLFWwindow* handle, int attrib, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    value = value ? GLFW_TRUE : GLFW_FALSE;

    if (attrib == GLFW_AUTO_ICONIFY)
        window->autoIconify = value;
    else if (attrib == GLFW_RESIZABLE)
    {
        if (window->resizable == value)
            return;

        window->resizable = value;
        if (!window->monitor)
            _glfwPlatformSetWindowResizable(window, value);
    }
    else if (attrib == GLFW_DECORATED)
    {
        if (window->decorated == value)
            return;

        window->decorated = value;
        if (!window->monitor)
            _glfwPlatformSetWindowDecorated(window, value);
    }
    else if (attrib == GLFW_FLOATING)
    {
        if (window->floating == value)
            return;

        window->floating = value;
        if (!window->monitor)
            _glfwPlatformSetWindowFloating(window, value);
    }
    else if (attrib == GLFW_FOCUS_ON_SHOW)
        window->focusOnShow = value;
    else if (attrib == GLFW_MOUSE_PASSTHROUGH)
    {
        if (window->mousePassthrough == value)
            return;

        window->mousePassthrough = value;
        _glfwPlatformSetWindowMousePassthrough(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid window attribute 0x%08X", attrib);
}